

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testC14N.c
# Opt level: O1

int test_c14n(char *xml_filename,int with_comments,int mode,char *xpath_filename,
             xmlChar **inclusive_namespaces)

{
  int iVar1;
  uint uVar2;
  undefined4 *puVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ssize_t sVar9;
  char *__format;
  undefined8 uVar10;
  long *plVar11;
  xmlChar *result;
  void *local_48;
  int local_3c;
  char *local_38;
  
  local_48 = (void *)0x0;
  puVar3 = (undefined4 *)__xmlLoadExtDtdDefaultValue();
  *puVar3 = 6;
  xmlSubstituteEntitiesDefault(1);
  lVar4 = xmlReadFile(xml_filename,0,10);
  if (lVar4 == 0) {
    fprintf(_stderr,"Error: unable to parse file \"%s\"\n",xml_filename);
    return -1;
  }
  lVar5 = xmlDocGetRootElement(lVar4);
  if (lVar5 == 0) {
    fprintf(_stderr,"Error: empty document for file \"%s\"\n",xml_filename);
    xmlFreeDoc(lVar4);
    return -1;
  }
  local_38 = xml_filename;
  if (xpath_filename == (char *)0x0) {
    lVar6 = 0;
    goto LAB_00101894;
  }
  local_3c = with_comments;
  puVar3 = (undefined4 *)__xmlLoadExtDtdDefaultValue();
  *puVar3 = 6;
  xmlSubstituteEntitiesDefault(1);
  lVar5 = xmlReadFile(xpath_filename,0,10);
  if (lVar5 == 0) {
    lVar6 = 0;
    fprintf(_stderr,"Error: unable to parse file \"%s\"\n",xpath_filename);
  }
  else {
    lVar6 = xmlDocGetRootElement(lVar5);
    if (lVar6 == 0) {
      lVar6 = 0;
      fprintf(_stderr,"Error: empty document for file \"%s\"\n",xpath_filename);
      xmlFreeDoc(lVar5);
    }
    else {
      for (lVar6 = *(long *)(lVar5 + 0x18); lVar6 != 0; lVar6 = *(long *)(lVar6 + 0x30)) {
        iVar1 = xmlStrEqual(*(undefined8 *)(lVar6 + 0x10),"XPath");
        if (iVar1 != 0) {
          lVar7 = xmlNodeGetContent(lVar6);
          if (lVar7 == 0) {
            __format = "Error: XPath content element is NULL \"%s\"\n";
            goto LAB_001019db;
          }
          lVar8 = xmlXPathNewContext(lVar4);
          if (lVar8 != 0) {
            plVar11 = (long *)(lVar6 + 0x60);
            goto LAB_0010180f;
          }
          test_c14n_cold_3();
          goto LAB_00101a08;
        }
      }
      __format = "Error: XPath element expected in the file  \"%s\"\n";
LAB_001019db:
      lVar6 = 0;
      fprintf(_stderr,__format,xpath_filename);
LAB_0010186d:
      xmlFreeDoc(lVar5);
    }
  }
  goto LAB_0010187a;
  while (iVar1 = xmlXPathRegisterNs(lVar8,plVar11[3],plVar11[2]), iVar1 == 0) {
LAB_0010180f:
    plVar11 = (long *)*plVar11;
    if (plVar11 == (long *)0x0) {
      lVar6 = xmlXPathEvalExpression(lVar7,lVar8);
      if (lVar6 != 0) {
        (*_xmlFree)(lVar7);
        xmlXPathFreeContext(lVar8);
        goto LAB_0010186d;
      }
      test_c14n_cold_2();
      goto LAB_00101a08;
    }
  }
  test_c14n_cold_1();
LAB_00101a08:
  lVar6 = 0;
LAB_0010187a:
  with_comments = local_3c;
  if (lVar6 == 0) {
    test_c14n_cold_4();
    return -1;
  }
LAB_00101894:
  if (lVar6 == 0) {
    uVar10 = 0;
  }
  else {
    uVar10 = *(undefined8 *)(lVar6 + 8);
  }
  uVar2 = xmlC14NDocDumpMemory(lVar4,uVar10,mode,inclusive_namespaces,with_comments,&local_48);
  if ((int)uVar2 < 0) {
    test_c14n_cold_5();
    return -1;
  }
  if (local_48 != (void *)0x0) {
    sVar9 = write(1,local_48,(ulong)uVar2);
    if (sVar9 == -1) {
      test_c14n_cold_6();
    }
    (*_xmlFree)(local_48);
  }
  if (lVar6 != 0) {
    xmlXPathFreeObject(lVar6);
  }
  xmlFreeDoc(lVar4);
  return uVar2;
}

Assistant:

static int
test_c14n(const char* xml_filename, int with_comments, int mode,
	const char* xpath_filename, xmlChar **inclusive_namespaces) {
    xmlDocPtr doc;
    xmlXPathObjectPtr xpath = NULL;
    xmlChar *result = NULL;
    int ret;

    /*
     * build an XML tree from a the file; we need to add default
     * attributes and resolve all character and entities references
     */
    xmlLoadExtDtdDefaultValue = XML_DETECT_IDS | XML_COMPLETE_ATTRS;
    xmlSubstituteEntitiesDefault(1);

    doc = xmlReadFile(xml_filename, NULL, XML_PARSE_DTDATTR | XML_PARSE_NOENT);
    if (doc == NULL) {
	fprintf(stderr, "Error: unable to parse file \"%s\"\n", xml_filename);
	return(-1);
    }

    /*
     * Check the document is of the right kind
     */
    if(xmlDocGetRootElement(doc) == NULL) {
        fprintf(stderr,"Error: empty document for file \"%s\"\n", xml_filename);
	xmlFreeDoc(doc);
	return(-1);
    }

    /*
     * load xpath file if specified
     */
    if(xpath_filename) {
	xpath = load_xpath_expr(doc, xpath_filename);
	if(xpath == NULL) {
	    fprintf(stderr,"Error: unable to evaluate xpath expression\n");
	    xmlFreeDoc(doc);
	    return(-1);
	}
    }

    /*
     * Canonical form
     */
    /* fprintf(stderr,"File \"%s\" loaded: start canonization\n", xml_filename); */
    ret = xmlC14NDocDumpMemory(doc,
	    (xpath) ? xpath->nodesetval : NULL,
	    mode, inclusive_namespaces,
	    with_comments, &result);
    if(ret >= 0) {
	if(result != NULL) {
	    if (write(STDOUT_FILENO, result, ret) == -1) {
		fprintf(stderr, "Can't write data\n");
	    }
	    xmlFree(result);
	}
    } else {
	fprintf(stderr,"Error: failed to canonicalize XML file \"%s\" (ret=%d)\n", xml_filename, ret);
	if(result != NULL) xmlFree(result);
	xmlFreeDoc(doc);
	return(-1);
    }

    /*
     * Cleanup
     */
    if(xpath != NULL) xmlXPathFreeObject(xpath);
    xmlFreeDoc(doc);

    return(ret);
}